

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O2

void __thiscall level_tools::push_ext_meshes(level_tools *this,level_mesh *mesh)

{
  xr_level_spawn *pxVar1;
  cse_abstract **ppcVar2;
  cse_abstract *pcVar3;
  pointer ppxVar4;
  pointer ppxVar5;
  uint uVar6;
  bool bVar7;
  uint16_t sector_idx;
  uint16_t uVar8;
  uint16_t uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  xr_gamemtl *pxVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  shape_def_vec *psVar14;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  size_t hint;
  pointer ppxVar15;
  size_t hint_00;
  pointer pcVar16;
  const_iterator __first;
  char *format;
  pointer ppxVar17;
  cse_abstract **ppcVar18;
  xr_ogf *pxVar19;
  _matrix<float> local_70;
  
  if (this->m_level->m_spawn != (xr_level_spawn *)0x0) {
    pxVar13 = xray_re::xr_gamemtls_lib::get_material(this->m_gamemtls_lib,this->m_ladders_gamemtl);
    if (pxVar13 == (xr_gamemtl *)0x0) {
      __assert_fail("gamemtl",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                    ,0x172,"void level_tools::push_ext_meshes(level_mesh *)");
    }
    hint = ((long)(this->m_textures->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_textures->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
    hint_00 = ((long)(this->m_shaders->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_shaders->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
    pxVar1 = this->m_level->m_spawn;
    ppxVar17 = (this->m_level->m_brkbl_meshes).
               super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppcVar2 = (pxVar1->m_spawns).
              super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    uVar6 = pxVar13->id;
    __first._M_current =
         (pxVar1->m_spawns).
         super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    for (ppcVar18 = __first._M_current; ppcVar18 != ppcVar2; ppcVar18 = ppcVar18 + 1) {
      pcVar3 = *ppcVar18;
      bVar7 = std::operator==(&pcVar3->m_s_name,"breakable_object");
      if (bVar7) {
        pxVar19 = *ppxVar17;
        ppxVar17 = ppxVar17 + 1;
LAB_001356a1:
        xray_re::_matrix<float>::set_xyz(&local_70,&pcVar3->m_o_angle);
        local_70.field_0._48_8_ = *(undefined8 *)&(pcVar3->m_o_position).field_0;
        local_70.field_0.field_0._43 = (pcVar3->m_o_position).field_0.field_0.z;
        sector_idx = get_sector_idx(this,&pcVar3->m_o_position);
        if (pxVar19 == (xr_ogf *)0x0) {
          iVar10 = (*pcVar3->_vptr_cse_abstract[7])(pcVar3);
          psVar14 = xray_re::cse_shape::shapes((cse_shape *)CONCAT44(extraout_var_03,iVar10));
          level_mesh::push(mesh,sector_idx,
                           (psVar14->
                           super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>
                           )._M_impl.super__Vector_impl_data._M_start,&local_70,0,0,(uint16_t)uVar6)
          ;
LAB_001358ff:
          (*pcVar3->_vptr_cse_abstract[1])();
        }
        else {
          ppxVar4 = (pxVar19->super_xr_object).m_bones.
                    super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (ppxVar4 ==
              (pxVar19->super_xr_object).m_bones.
              super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pcVar16 = (pxVar19->m_path)._M_dataplus._M_p;
            format = "empty skeleton in %s";
          }
          else {
            pxVar13 = xray_re::xr_gamemtls_lib::get_material
                                (this->m_gamemtls_lib,((*ppxVar4)->m_gamemtl)._M_dataplus._M_p);
            if (pxVar13 != (xr_gamemtl *)0x0) {
              iVar10 = (*(pxVar19->super_xr_object).super_xr_surface_factory.
                         _vptr_xr_surface_factory[0x16])(pxVar19);
              if ((char)iVar10 == '\0') {
                iVar10 = (*(pxVar19->super_xr_object).super_xr_surface_factory.
                           _vptr_xr_surface_factory[0x1f])(pxVar19);
                iVar11 = (*(pxVar19->super_xr_object).super_xr_surface_factory.
                           _vptr_xr_surface_factory[0x20])(pxVar19);
                iVar12 = (*(pxVar19->super_xr_object).super_xr_surface_factory.
                           _vptr_xr_surface_factory[0x1b])(pxVar19);
                uVar8 = add_texture(this,(string *)CONCAT44(extraout_var_06,iVar12),hint);
                iVar12 = (*(pxVar19->super_xr_object).super_xr_surface_factory.
                           _vptr_xr_surface_factory[0x1c])(pxVar19);
                uVar9 = add_shader(this,(string *)CONCAT44(extraout_var_07,iVar12),hint_00);
                level_mesh::push(mesh,sector_idx,(xr_vbuf *)CONCAT44(extraout_var_04,iVar10),
                                 (xr_ibuf *)CONCAT44(extraout_var_05,iVar11),&local_70,uVar8,uVar9,
                                 (uint16_t)pxVar13->id);
              }
              else {
                ppxVar5 = (pxVar19->m_children).
                          super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                for (ppxVar15 = (pxVar19->m_children).
                                super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>
                                ._M_impl.super__Vector_impl_data._M_start; ppxVar15 != ppxVar5;
                    ppxVar15 = ppxVar15 + 1) {
                  pxVar19 = *ppxVar15;
                  iVar10 = (*(pxVar19->super_xr_object).super_xr_surface_factory.
                             _vptr_xr_surface_factory[0x1f])(pxVar19);
                  iVar11 = (*(pxVar19->super_xr_object).super_xr_surface_factory.
                             _vptr_xr_surface_factory[0x20])(pxVar19);
                  iVar12 = (*(pxVar19->super_xr_object).super_xr_surface_factory.
                             _vptr_xr_surface_factory[0x1b])(pxVar19);
                  uVar8 = add_texture(this,(string *)CONCAT44(extraout_var_01,iVar12),hint);
                  iVar12 = (*(pxVar19->super_xr_object).super_xr_surface_factory.
                             _vptr_xr_surface_factory[0x1c])(pxVar19);
                  uVar9 = add_shader(this,(string *)CONCAT44(extraout_var_02,iVar12),hint_00);
                  level_mesh::push(mesh,sector_idx,(xr_vbuf *)CONCAT44(extraout_var,iVar10),
                                   (xr_ibuf *)CONCAT44(extraout_var_00,iVar11),&local_70,uVar8,uVar9
                                   ,(uint16_t)pxVar13->id);
                }
              }
              goto LAB_001358ff;
            }
            pcVar16 = *(pointer *)
                       (**(long **)&(pxVar19->super_xr_object).m_bones.
                                    super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>
                                    ._M_impl.super__Vector_impl_data + 0x250);
            format = "can\'t resolve game material %s";
          }
          xray_re::msg(format,pcVar16);
        }
      }
      else {
        bVar7 = std::operator==(&pcVar3->m_s_name,"climable_object");
        if (bVar7) {
          pxVar19 = (xr_ogf *)0x0;
          goto LAB_001356a1;
        }
        if (__first._M_current != ppcVar18) {
          *__first._M_current = *ppcVar18;
        }
        __first._M_current = __first._M_current + 1;
      }
    }
    std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>::erase
              (&pxVar1->m_spawns,__first,
               (const_iterator)
               (pxVar1->m_spawns).
               super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void level_tools::push_ext_meshes(level_mesh* mesh)
{
	if (m_level->spawn() == 0)
		return;
	const xr_gamemtl* gamemtl = m_gamemtls_lib->get_material(m_ladders_gamemtl);
	xr_assert(gamemtl);
	uint16_t clmbl_gamemtl = gamemtl->id;
	size_t texture_hint = m_textures->size() - 1;
	size_t shader_hint = m_shaders->size() - 1;
	xr_ogf_vec_cit brkbl_it = m_level->brkbl_meshes().begin();;
	xr_entity_vec& spawns = m_level->spawn()->spawns();
	xr_entity_vec_it last = spawns.begin();
	for (xr_entity_vec_it it = last, end = spawns.end(); it != end; ++it) {
		const xr_ogf* ogf;
		cse_abstract* entity = *it;
		if (entity->name() == "breakable_object") {
			ogf = *brkbl_it++;
		} else if (entity->name() == "climable_object") {
			ogf = 0;
		} else {
			if (last != it)
				*last = *it;
			++last;
			continue;
		}

		fmatrix xform;
		xform.set_xyz(entity->rotation());
		xform.c.set(entity->position());

		uint16_t sector_idx = get_sector_idx(entity->position());

		if (ogf == 0) {
			mesh->push(sector_idx, entity->shape()->shapes().front(), xform,
					0, 0, clmbl_gamemtl);
		} else {
			if (ogf->bones().empty()) {
				msg("empty skeleton in %s", ogf->path().c_str());
				goto skip;
			}
			// FIXME: what if there are many different materials?
			gamemtl = m_gamemtls_lib->get_material(ogf->bones().front()->gamemtl().c_str());
			if (gamemtl == 0) {
				msg("can't resolve game material %s", ogf->bones().front()->gamemtl().c_str());
				goto skip;
			}
			if (ogf->hierarchical()) {
				for (xr_ogf_vec_cit it1 = ogf->children().begin(),
						end1 = ogf->children().end(); it1 != end1; ++it1) {
					const xr_ogf* ogf1 = static_cast<const xr_ogf*>(*it1);
					mesh->push(sector_idx, ogf1->vb(), ogf1->ib(), xform,
							add_texture(ogf1->texture(), texture_hint),
							add_shader(ogf1->shader(), shader_hint),
							gamemtl->id);
				}
			} else {
				mesh->push(sector_idx, ogf->vb(), ogf->ib(), xform,
						add_texture(ogf->texture(), texture_hint),
						add_shader(ogf->shader(), shader_hint),
						gamemtl->id);
			}
		}
		delete entity;
skip:;
	}
	spawns.erase(last, spawns.end());
}